

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O3

void __thiscall
QEglFSKmsGbmScreen::cloneDestFlipFinished
          (QEglFSKmsGbmScreen *this,QEglFSKmsGbmScreen *cloneDestScreen)

{
  iterator iVar1;
  iterator iVar2;
  
  iVar1 = QList<QEglFSKmsGbmScreen::CloneDestination>::begin(&this->m_cloneDests);
  iVar2 = QList<QEglFSKmsGbmScreen::CloneDestination>::end(&this->m_cloneDests);
  do {
    if (iVar1.i == iVar2.i) {
LAB_00113dd9:
      (**(code **)(*(long *)this + 0x108))(this);
      return;
    }
    if ((iVar1.i)->screen == cloneDestScreen) {
      (iVar1.i)->cloneFlipPending = false;
      goto LAB_00113dd9;
    }
    iVar1.i = iVar1.i + 1;
  } while( true );
}

Assistant:

void QEglFSKmsGbmScreen::cloneDestFlipFinished(QEglFSKmsGbmScreen *cloneDestScreen)
{
    for (CloneDestination &d : m_cloneDests) {
        if (d.screen == cloneDestScreen) {
            d.cloneFlipPending = false;
            break;
        }
    }
    updateFlipStatus();
}